

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyTemperatures.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<7,2>::CoherentElastic::
     verifyTemperatures<std::vector<njoy::ENDFtk::ListRecord,std::allocator<njoy::ENDFtk::ListRecord>>>
               (int NP,vector<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>
                       *temperatures)

{
  pointer pLVar1;
  undefined8 *puVar2;
  pointer pLVar3;
  
  pLVar3 = (temperatures->
           super__Vector_base<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (temperatures->
           super__Vector_base<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pLVar3 == pLVar1) {
LAB_0013f541:
    if (pLVar3 != pLVar1) {
      tools::Log::error<char_const*>("All S(E,T) functions must have the same size");
      tools::Log::info<char_const*,int,long>
                ("Expected NP={} for the temperature with index={}",NP,
                 ((long)pLVar3 -
                  (long)(temperatures->
                        super__Vector_base<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = getenv;
      __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
    }
  }
  else {
    do {
      if ((long)(pLVar3->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pLVar3->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)NP) goto LAB_0013f541;
      pLVar3 = pLVar3 + 1;
    } while (pLVar3 != pLVar1);
  }
  return;
}

Assistant:

static void
verifyTemperatures( int NP, const Array& temperatures ) {

  auto compare = [NP] ( const auto& entry )
                      { return entry.NPL() == NP; };

  auto iter = ranges::cpp20::find_if_not( temperatures, compare );

  if ( iter != ranges::cpp20::end( temperatures ) ) {

    Log::error( "All S(E,T) functions must have the same size" );
    Log::info( "Expected NP={} for the temperature with index={}", NP,
               ranges::cpp20::distance(
                   ranges::cpp20::begin( temperatures ), iter ) );
    throw std::exception();
  }
}